

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void gola_fixup(LexState *ls,FuncScope *bl)

{
  uint8_t *puVar1;
  VarInfo *pVVar2;
  uint list;
  uint64_t uVar3;
  FuncState *fs;
  VarInfo *pVVar4;
  byte bVar5;
  VarInfo *pVVar6;
  VarInfo *pVVar7;
  
  if (bl->vstart < ls->vtop) {
    pVVar2 = ls->vstack + ls->vtop;
    pVVar7 = ls->vstack + bl->vstart;
    do {
      uVar3 = (pVVar7->name).gcptr64;
      if (uVar3 != 0) {
        if ((pVVar7->info & 4) == 0) {
          if ((pVVar7->info & 2) != 0) {
            if (bl->prev == (FuncScope *)0x0) {
              ls->linenumber = ls->fs->bcbase[pVVar7->startpc].line;
              if (uVar3 != 1) {
                lj_lex_error(ls,0,LJ_ERR_XLUNDEF,uVar3 + 0x18);
              }
              lj_lex_error(ls,0,LJ_ERR_XBREAK);
            }
            puVar1 = &bl->prev->flags;
            *puVar1 = *puVar1 | (uVar3 != 1) * '\x02' + 2U;
            pVVar7->slot = bl->nactvar;
            if ((bl->flags & 8) != 0) {
              gola_close((LexState *)ls->fs,(VarInfo *)(ulong)pVVar7->startpc);
            }
          }
        }
        else {
          (pVVar7->name).gcptr64 = 0;
          pVVar6 = pVVar7;
          while (pVVar4 = pVVar6, pVVar6 = pVVar4 + 1, pVVar6 < pVVar2) {
            if (((pVVar6->name).gcptr64 == uVar3) && ((pVVar4[1].info & 2) != 0)) {
              bVar5 = pVVar7->slot;
              if (((bl->flags & 8) != 0) && (bVar5 < pVVar4[1].slot)) {
                gola_close((LexState *)ls->fs,(VarInfo *)(ulong)pVVar4[1].startpc);
                bVar5 = pVVar7->slot;
              }
              fs = ls->fs;
              list = pVVar4[1].startpc;
              (pVVar6->name).gcptr64 = 0;
              *(byte *)((long)&fs->bcbase[list].ins + 1) = bVar5;
              jmp_patch(fs,list,pVVar7->startpc);
            }
          }
        }
      }
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 < pVVar2);
  }
  return;
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}